

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_fmul(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  Value VVar2;
  undefined8 local_40;
  Value value_1;
  Value value_2;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::popTopOfOperandStack(this_01);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  value_1.data.longValue._4_4_ = VVar1.type;
  if (value_1.data.longValue._4_4_ != 5) {
    __assert_fail("value_2.type == ValueType::FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x84d,"void ExecutionEngine::i_fmul()");
  }
  local_40._4_4_ = VVar2.type;
  if (local_40._4_4_ == FLOAT) {
    value_1.printType = VVar2.data._0_4_;
    value_2.printType = VVar1.data._0_4_;
    value_1.type = VVar2.data._4_4_;
    local_40 = VVar2._0_8_;
    value_1.printType = (ValueType)((float)value_1.printType * (float)value_2.printType);
    VVar1.data = (anon_union_8_10_52016fac_for_data)value_1._0_8_;
    VVar1.printType = (undefined4)local_40;
    VVar1.type = local_40._4_4_;
    Frame::pushIntoOperandStack(this_01,VVar1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x84e,"void ExecutionEngine::i_fmul()");
}

Assistant:

void ExecutionEngine::i_fmul() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();

	assert(value_2.type == ValueType::FLOAT);
	assert(value_1.type == ValueType::FLOAT);

	value_1.data.floatValue = value_1.data.floatValue * (value_2.data.floatValue);
	topFrame->pushIntoOperandStack(value_1);

	topFrame->pc += 1;
}